

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

ggml_tensor * __thiscall
llm_graph_context::build_inp_embd(llm_graph_context *this,ggml_tensor *tok_embd)

{
  float fVar1;
  uint32_t uVar2;
  llama_ubatch *plVar3;
  ggml_tensor *pgVar4;
  ggml_context *pgVar5;
  _func_int **pp_Var6;
  ggml_tensor *cur;
  llama_adapter_lora_weight *plVar7;
  undefined8 uVar8;
  pointer *__ptr;
  __node_base *p_Var9;
  float fVar10;
  llm_graph_input_i *local_48;
  _Head_base<0UL,_llm_graph_input_i_*,_false> local_38;
  
  uVar2 = this->hparams->n_embd;
  std::make_unique<llm_graph_input_embd>();
  plVar3 = this->ubatch;
  if (plVar3->token == (llama_token *)0x0) {
    pp_Var6 = (_func_int **)ggml_new_tensor_2d(this->ctx0,0,uVar2,plVar3->n_tokens);
    local_48[2]._vptr_llm_graph_input_i = pp_Var6;
    ggml_set_input(pp_Var6);
    cur = (ggml_tensor *)local_48[2]._vptr_llm_graph_input_i;
  }
  else {
    pp_Var6 = (_func_int **)ggml_new_tensor_1d(this->ctx0,0x1a,plVar3->n_tokens);
    local_48[1]._vptr_llm_graph_input_i = pp_Var6;
    ggml_set_input(pp_Var6);
    cur = (ggml_tensor *)ggml_get_rows(this->ctx0,tok_embd,local_48[1]._vptr_llm_graph_input_i);
    p_Var9 = &(this->loras->_M_h)._M_before_begin;
    while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
      plVar7 = llama_adapter_lora::get_weight((llama_adapter_lora *)p_Var9[1]._M_nxt,tok_embd);
      if (plVar7 != (llama_adapter_lora_weight *)0x0) {
        fVar10 = ((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor;
        fVar1 = *(float *)&p_Var9[1]._M_nxt[0xd]._M_nxt;
        pgVar4 = plVar7->b;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          fVar10 = (fVar10 * fVar1) / (float)pgVar4->ne[0];
        }
        pgVar5 = this->ctx0;
        uVar8 = ggml_get_rows(pgVar5,plVar7->a,local_48[1]._vptr_llm_graph_input_i);
        uVar8 = ggml_mul_mat(pgVar5,pgVar4,uVar8);
        uVar8 = ggml_scale(fVar10,pgVar5,uVar8);
        cur = (ggml_tensor *)ggml_add(this->ctx0,cur,uVar8);
      }
    }
  }
  fVar10 = this->hparams->f_embedding_scale;
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    cur = (ggml_tensor *)ggml_scale(this->ctx0,cur);
  }
  cb(this,cur,"inp_embd",-1);
  local_38._M_head_impl = local_48;
  llm_graph_result::add_input
            ((this->res)._M_t.
             super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
             super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
             super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl,
             (llm_graph_input_ptr *)&local_38);
  if (local_38._M_head_impl != (llm_graph_input_i *)0x0) {
    (*(local_38._M_head_impl)->_vptr_llm_graph_input_i[1])();
  }
  return cur;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_embd(ggml_tensor * tok_embd) const {
    const int64_t n_embd = hparams.n_embd;

    auto inp = std::make_unique<llm_graph_input_embd>();

    ggml_tensor * cur = nullptr;

    if (ubatch.token) {
        inp->tokens = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ubatch.n_tokens);
        //cb(inp->tokens, "inp_tokens", -1);
        ggml_set_input(inp->tokens);

        cur = ggml_get_rows(ctx0, tok_embd, inp->tokens);

        // apply lora for embedding tokens if needed
        for (const auto & lora : *loras) {
            llama_adapter_lora_weight * lw = lora.first->get_weight(tok_embd);
            if (lw == nullptr) {
                continue;
            }

            const float adapter_scale = lora.second;
            const float scale = lw->get_scale(lora.first->alpha, adapter_scale);

            ggml_tensor * inpL_delta = ggml_scale(ctx0, ggml_mul_mat(
                        ctx0, lw->b, // non-transposed lora_b
                        ggml_get_rows(ctx0, lw->a, inp->tokens)
                        ), scale);

            cur = ggml_add(ctx0, cur, inpL_delta);
        }
    } else {
        inp->embd = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_embd, ubatch.n_tokens);
        ggml_set_input(inp->embd);

        cur = inp->embd;
    }

    // For Granite architecture
    if (hparams.f_embedding_scale != 0.0f) {
        cur = ggml_scale(ctx0, cur, hparams.f_embedding_scale);
    }

    cb(cur, "inp_embd", -1);

    res->add_input(std::move(inp));

    return cur;
}